

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbndmat.cpp
# Opt level: O2

complex<long_double> * __thiscall
TPZSBMatrix<std::complex<long_double>_>::GetVal
          (complex<long_double> *__return_storage_ptr__,
          TPZSBMatrix<std::complex<long_double>_> *this,int64_t row,int64_t col)

{
  undefined8 *puVar1;
  long lVar2;
  complex<long_double> *pcVar3;
  complex<long_double> *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  longdouble lVar10;
  longdouble lVar11;
  
  lVar2 = this->fBand;
  lVar9 = row - col;
  if (lVar9 == 0 || row < col) {
    if (col - row <= lVar2) {
      lVar8 = (lVar2 + 1) * col;
      pcVar4 = (this->fDiag).fStore;
      pcVar3 = pcVar4 + lVar9 + lVar2 + lVar8;
      uVar5 = *(undefined8 *)pcVar3->_M_value;
      uVar6 = *(undefined8 *)(pcVar3->_M_value + 8);
      puVar1 = (undefined8 *)(pcVar4[lVar9 + lVar2 + lVar8]._M_value + 0x10);
      uVar7 = puVar1[1];
      *(undefined8 *)(__return_storage_ptr__->_M_value + 0x10) = *puVar1;
      *(undefined8 *)(__return_storage_ptr__->_M_value + 0x18) = uVar7;
      *(undefined8 *)__return_storage_ptr__->_M_value = uVar5;
      *(undefined8 *)(__return_storage_ptr__->_M_value + 8) = uVar6;
      return __return_storage_ptr__;
    }
  }
  else if (lVar9 <= lVar2) {
    lVar9 = (lVar2 + 1) * row;
    pcVar3 = (this->fDiag).fStore;
    lVar10 = *(longdouble *)pcVar3[(col - row) + lVar2 + lVar9]._M_value;
    lVar11 = -*(longdouble *)(pcVar3[(col - row) + lVar2 + lVar9]._M_value + 0x10);
    goto LAB_00d7e3be;
  }
  lVar10 = (longdouble)0;
  lVar11 = lVar10;
LAB_00d7e3be:
  *(longdouble *)__return_storage_ptr__->_M_value = lVar10;
  *(longdouble *)(__return_storage_ptr__->_M_value + 0x10) = lVar11;
  return __return_storage_ptr__;
}

Assistant:

const TVar
TPZSBMatrix<TVar>::GetVal(const int64_t row,const int64_t col ) const
{
    if ( row > col ){
        if (auto index = row-col; index > fBand ){
            return (TVar) 0;//out of band
        }else if constexpr(is_complex<TVar>::value){
            return( std::conj(fDiag[Index(col,row)]) );
        }else{
            return( fDiag[ Index(col,row) ] );
        }
    }
    
    if (auto index = col-row; index > fBand ){
        return (TVar) 0;//out of band
    }else{
        return( fDiag[ Index(row,col) ] );
    }
}